

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

double sqlite3VdbeRealValue(Mem *pMem)

{
  ushort uVar1;
  long in_FS_OFFSET;
  double dStack_18;
  long lStack_10;
  
  uVar1 = pMem->flags;
  if ((uVar1 & 8) != 0) {
    return (pMem->u).r;
  }
  if ((uVar1 & 0x24) != 0) {
    return (double)(pMem->u).i;
  }
  if ((uVar1 & 0x12) == 0) {
    return 0.0;
  }
  lStack_10 = *(long *)(in_FS_OFFSET + 0x28);
  dStack_18 = 0.0;
  sqlite3AtoF(pMem->z,&dStack_18,pMem->n,pMem->enc);
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_10) {
    return dStack_18;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE double sqlite3VdbeRealValue(Mem *pMem){
  assert( pMem!=0 );
  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( EIGHT_BYTE_ALIGNMENT(pMem) );
  if( pMem->flags & MEM_Real ){
    return pMem->u.r;
  }else if( pMem->flags & (MEM_Int|MEM_IntReal) ){
    testcase( pMem->flags & MEM_IntReal );
    return (double)pMem->u.i;
  }else if( pMem->flags & (MEM_Str|MEM_Blob) ){
    return memRealValue(pMem);
  }else{
    /* (double)0 In case of SQLITE_OMIT_FLOATING_POINT... */
    return (double)0;
  }
}